

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
          (ImplicitProducer *this,BufferEvictionNode *element)

{
  ulong uVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  Block *pBVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  
  uVar1 = *(ulong *)(this + 0x20);
  uVar7 = uVar1 & 0x1f;
  if (uVar7 == 0) {
    if (((*(long *)(this + 0x28) - uVar1) + 0x7fffffffffffffdf < 0x7fffffffffffffff) &&
       (plVar2 = *(long **)(this + 0x60), plVar2 != (long *)0x0)) {
      uVar6 = *plVar2 - 1U & plVar2[1] + 1U;
      puVar8 = *(ulong **)(plVar2[3] + uVar6 * 8);
      if ((*puVar8 == 1) || (puVar8[1] == 0)) {
        *puVar8 = uVar1;
        plVar2[1] = uVar6;
      }
      else {
        bVar4 = ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                ::ImplicitProducer::new_block_index((ImplicitProducer *)this);
        if (!bVar4) goto LAB_01035969;
        plVar2 = *(long **)(this + 0x60);
        uVar6 = *plVar2 - 1U & plVar2[1] + 1U;
        puVar8 = *(ulong **)(plVar2[3] + uVar6 * 8);
        *puVar8 = uVar1;
        plVar2[1] = uVar6;
      }
      pBVar5 = requisition_block<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0>
                         (*(ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                            **)(this + 0x50));
      if (pBVar5 != (Block *)0x0) {
        (pBVar5->elementsCompletelyDequeued).super___atomic_base<unsigned_long>._M_i = 0;
        puVar8[1] = (ulong)pBVar5;
        *(Block **)(this + 0x40) = pBVar5;
        goto LAB_01035866;
      }
      plVar2 = *(long **)(this + 0x60);
      plVar2[1] = *plVar2 - 1U & plVar2[1] - 1U;
      puVar8[1] = 0;
    }
LAB_01035969:
    bVar4 = false;
  }
  else {
    pBVar5 = *(Block **)(this + 0x40);
LAB_01035866:
    p_Var3 = (element->handle).internal.
             super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    *(element_type **)(pBVar5->elements + uVar7 * 0x18) =
         (element->handle).internal.
         super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pBVar5->elements + uVar7 * 0x18 + 8) = p_Var3
    ;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (element->handle).internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(idx_t *)(pBVar5->elements + uVar7 * 0x18 + 0x10) = element->handle_sequence_number;
    *(ulong *)(this + 0x20) = uVar1 + 1;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

inline bool enqueue(U&& element)
		{
			index_t currentTailIndex = this->tailIndex.load(std::memory_order_relaxed);
			index_t newTailIndex = 1 + currentTailIndex;
			if ((currentTailIndex & static_cast<index_t>(BLOCK_SIZE - 1)) == 0) {
				// We reached the end of a block, start a new one
				auto head = this->headIndex.load(std::memory_order_relaxed);
				assert(!details::circular_less_than<index_t>(currentTailIndex, head));
				if (!details::circular_less_than<index_t>(head, currentTailIndex + BLOCK_SIZE) || (MAX_SUBQUEUE_SIZE != details::const_numeric_max<size_t>::value && (MAX_SUBQUEUE_SIZE == 0 || MAX_SUBQUEUE_SIZE - BLOCK_SIZE < currentTailIndex - head))) {
					return false;
				}
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
				debug::DebugLock lock(mutex);
#endif
				// Find out where we'll be inserting this block in the block index
				BlockIndexEntry* idxEntry;
				if (!insert_block_index_entry<allocMode>(idxEntry, currentTailIndex)) {
					return false;
				}
				
				// Get ahold of a new block
				auto newBlock = this->parent->ConcurrentQueue::template requisition_block<allocMode>();
				if (newBlock == nullptr) {
					rewind_block_index_tail();
					idxEntry->value.store(nullptr, std::memory_order_relaxed);
					return false;
				}
#ifdef MCDBGQ_TRACKMEM
				newBlock->owner = this;
#endif
				newBlock->ConcurrentQueue::Block::template reset_empty<implicit_context>();
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					// May throw, try to insert now before we publish the fact that we have this new block
					MOODYCAMEL_TRY {
						new ((*newBlock)[currentTailIndex]) T(std::forward<U>(element));
					}
					MOODYCAMEL_CATCH (...) {
						rewind_block_index_tail();
						idxEntry->value.store(nullptr, std::memory_order_relaxed);
						this->parent->add_block_to_free_list(newBlock);
						MOODYCAMEL_RETHROW;
					}
				}
				
				// Insert the new block into the index
				idxEntry->value.store(newBlock, std::memory_order_relaxed);
				
				this->tailBlock = newBlock;
				
				if (!MOODYCAMEL_NOEXCEPT_CTOR(T, U, new ((T*)nullptr) T(std::forward<U>(element)))) {
					this->tailIndex.store(newTailIndex, std::memory_order_release);
					return true;
				}
			}